

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_unpause(Curl_easy *data)

{
  undefined8 *puVar1;
  byte bVar2;
  int type;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  CURLcode CVar6;
  ulong uVar7;
  char *optr;
  size_t olen;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  dynbuf *s;
  long lVar11;
  tempbuf writebuf [3];
  undefined8 auStack_d38 [399];
  undefined8 uStack_c0;
  long local_b0;
  dynbuf dStack_a8;
  int iStack_88;
  byte abStack_84 [84];
  
  uVar10 = (ulong)(data->state).tempcount;
  if (uVar10 == 0) {
    CVar6 = CURLE_OK;
  }
  else {
    lVar11 = 0xc90;
    uVar7 = uVar10;
    for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
      *(undefined8 *)((long)auStack_d38 + lVar11 + 0x20) =
           *(undefined8 *)((long)(data->last_poll).sockets + lVar11 + -0x70);
      puVar1 = (undefined8 *)((long)&data->magic + lVar11);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)((long)(&data->last_poll + -4) + lVar11);
      uVar5 = puVar1[1];
      *(undefined8 *)((long)auStack_d38 + lVar11 + 0x10) = *puVar1;
      *(undefined8 *)((long)auStack_d38 + lVar11 + 0x18) = uVar5;
      *(undefined8 *)((long)auStack_d38 + lVar11) = uVar3;
      *(undefined8 *)((long)auStack_d38 + lVar11 + 8) = uVar4;
      uStack_c0 = 0x4de027;
      Curl_dyn_init((dynbuf *)((long)&data->magic + lVar11),0x4000000);
      uVar7 = (ulong)(data->state).tempcount;
      lVar11 = lVar11 + 0x28;
    }
    (data->state).tempcount = 0;
    lVar11 = uVar10 * 0x28;
    CVar6 = CURLE_OK;
    local_b0 = lVar11;
    for (lVar9 = 0; lVar11 != lVar9; lVar9 = lVar9 + 0x28) {
      s = (dynbuf *)((long)&dStack_a8.bufr + lVar9);
      if (CVar6 == CURLE_OK) {
        type = *(int *)((long)&iStack_88 + lVar9);
        bVar2 = abStack_84[lVar9];
        uStack_c0 = 0x4de076;
        optr = Curl_dyn_ptr(s);
        uStack_c0 = 0x4de081;
        olen = Curl_dyn_len(s);
        lVar11 = local_b0;
        uStack_c0 = 0x4de099;
        CVar6 = chop_write(data,type,(bVar2 & 1) == 0,optr,olen);
      }
      uStack_c0 = 0x4de0a3;
      Curl_dyn_free(s);
    }
  }
  return CVar6;
}

Assistant:

CURLcode Curl_client_unpause(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;

  if(data->state.tempcount) {
    /* there are buffers for sending that can be delivered as the receive
       pausing is lifted! */
    unsigned int i;
    unsigned int count = data->state.tempcount;
    struct tempbuf writebuf[3]; /* there can only be three */

    /* copy the structs to allow for immediate re-pausing */
    for(i = 0; i < data->state.tempcount; i++) {
      writebuf[i] = data->state.tempwrite[i];
      Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
    }
    data->state.tempcount = 0;

    for(i = 0; i < count; i++) {
      /* even if one function returns error, this loops through and frees
         all buffers */
      if(!result)
        result = chop_write(data, writebuf[i].type,
                            !writebuf[i].paused_body,
                            Curl_dyn_ptr(&writebuf[i].b),
                            Curl_dyn_len(&writebuf[i].b));
      Curl_dyn_free(&writebuf[i].b);
    }
  }
  return result;
}